

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_estimateDStreamSize_fromFrame(void *src,size_t srcSize)

{
  ulong uVar1;
  size_t sStack_30;
  ZSTD_frameHeader zfh;
  
  sStack_30 = ZSTD_getFrameHeader(&zfh,src,srcSize);
  if (sStack_30 < 0xffffffffffffff89) {
    if (sStack_30 == 0) {
      if (zfh.windowSize < 0x80000001) {
        uVar1 = 0x20000;
        if (zfh.windowSize < 0x20000) {
          uVar1 = zfh.windowSize;
        }
        sStack_30 = zfh.windowSize + (uVar1 & 0xffffffff) * 2 + 0x271f8;
      }
      else {
        sStack_30 = 0xfffffffffffffff0;
      }
    }
    else {
      sStack_30 = 0xffffffffffffffb8;
    }
  }
  return sStack_30;
}

Assistant:

size_t ZSTD_estimateDStreamSize_fromFrame(const void* src, size_t srcSize)
{
    U32 const windowSizeMax = 1U << ZSTD_WINDOWLOG_MAX;   /* note : should be user-selectable */
    ZSTD_frameHeader zfh;
    size_t const err = ZSTD_getFrameHeader(&zfh, src, srcSize);
    if (ZSTD_isError(err)) return err;
    if (err>0) return ERROR(srcSize_wrong);
    if (zfh.windowSize > windowSizeMax)
        return ERROR(frameParameter_windowTooLarge);
    return ZSTD_estimateDStreamSize((size_t)zfh.windowSize);
}